

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::IssueMessage(cmake *this,MessageType t,string *text,cmListFileBacktrace *bt)

{
  bool bVar1;
  cmListFileBacktrace backtrace;
  ostringstream msg;
  cmListFileBacktrace local_1c0;
  ostream local_190;
  
  cmListFileBacktrace::cmListFileBacktrace(&local_1c0,bt);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  bVar1 = PrintMessagePreamble(this,t,&local_190);
  if (bVar1) {
    cmListFileBacktrace::PrintTitle(&local_1c0,&local_190);
    printMessageText(&local_190,text);
    cmListFileBacktrace::PrintCallStack(&local_1c0,&local_190);
    displayMessage(t,(ostringstream *)&local_190);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_1c0.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return;
}

Assistant:

void cmake::IssueMessage(cmake::MessageType t, std::string const& text,
                         cmListFileBacktrace const& bt)
{
  cmListFileBacktrace backtrace = bt;

  std::ostringstream msg;
  if (!this->PrintMessagePreamble(t, msg))
    {
    return;
    }

  // Add the immediate context.
  backtrace.PrintTitle(msg);

  printMessageText(msg, text);

  // Add the rest of the context.
  backtrace.PrintCallStack(msg);

  displayMessage(t, msg);
}